

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char16_t * u16tou16(char16_t *source)

{
  char16_t cVar1;
  long lVar2;
  size_t sVar3;
  char16_t *pcVar4;
  char16_t *p1;
  char16_t *pcVar5;
  size_t __size;
  
  if (source == (char16_t *)0x0) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
  }
  else {
    if (*source == 0) {
      __size = 1;
    }
    else {
      sVar3 = 1;
      do {
        __size = sVar3 + 2;
        lVar2 = sVar3 + 1;
        sVar3 = __size;
      } while (*(short *)((long)source + lVar2) != 0);
    }
    pcVar4 = (char16_t *)malloc(__size);
    pcVar5 = pcVar4;
    if (pcVar4 != (char16_t *)0x0) {
      do {
        cVar1 = *source;
        source = source + (cVar1 != 0);
        *pcVar5 = cVar1;
        pcVar5 = pcVar5 + 1;
      } while (*source != 0);
      return pcVar4;
    }
    g_lastError = OPENJTALKERROR_MALLOC_ERROR;
  }
  return (char16_t *)0x0;
}

Assistant:

char16_t *u16tou16(const char16_t *source)
{
	if (source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	char16_t *temp = (char16_t *)malloc(strlenU16(source) * sizeof(char16_t) + 1);
	if (!temp)
	{
		g_lastError = OPENJTALKERROR_MALLOC_ERROR;
		return NULL;
	}
	return strcpyU16(temp, source);
}